

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O3

void hitfloor(obj *obj,obj *ostack,boolean thrown)

{
  byte bVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  
  bVar1 = level->locations[u.ux][u.uy].typ;
  if ((((1 < (byte)(bVar1 - 0x25)) && (3 < bVar1 - 0x11)) && (bVar1 != 0x23)) &&
     ((u._1052_1_ & 2) == 0)) {
    if (bVar1 == 0x21) {
      doaltarobj(obj);
    }
    else {
      pcVar4 = Doname2(obj);
      pcVar6 = "";
      if (obj->quan == 1) {
        pcVar6 = "s";
      }
      pcVar5 = surface((int)u.ux,(int)u.uy);
      pline("%s hit%s the %s.",pcVar4,pcVar6,pcVar5);
    }
    bVar2 = detonate_obj(obj,ostack,uwep,(int)u.ux,(int)u.uy,thrown);
    if (bVar2 == '\0') {
      iVar3 = hero_breaks(obj,u.ux,u.uy,'\x01');
      if (iVar3 == 0) {
        bVar2 = ship_object(obj,u.ux,u.uy,'\0');
        if (bVar2 == '\0') {
          dropy(obj);
          if ((u._1052_1_ & 1) == 0) {
            container_impact_dmg(obj);
            return;
          }
        }
      }
    }
    return;
  }
  dropy(obj);
  return;
}

Assistant:

void hitfloor(struct obj *obj, struct obj *ostack, boolean thrown)
{
	if (IS_SOFT(level->locations[u.ux][u.uy].typ) || u.uinwater) {
		dropy(obj);
		return;
	}
	if (IS_ALTAR(level->locations[u.ux][u.uy].typ))
		doaltarobj(obj);
	else
		pline("%s hit%s the %s.", Doname2(obj),
		      (obj->quan == 1L) ? "s" : "", surface(u.ux,u.uy));

	if (detonate_obj(obj, ostack, uwep, u.ux, u.uy, thrown))
	    return;

	if (hero_breaks(obj, u.ux, u.uy, TRUE)) return;
	if (ship_object(obj, u.ux, u.uy, FALSE)) return;
	dropy(obj);
	if (!u.uswallow) container_impact_dmg(obj);
}